

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask.c
# Opt level: O2

void aom_blend_a64_mask_c
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h,int subw,int subh
               )

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  
  if (subh == 0 && subw == 0) {
    uVar4 = 0;
    if (w < 1) {
      w = uVar4;
    }
    if (h < 1) {
      h = uVar4;
    }
    uVar8 = 0;
    uVar10 = 0;
    uVar9 = 0;
    for (uVar12 = 0; uVar14 = (ulong)(uint)w, uVar5 = uVar4, uVar7 = uVar8, uVar13 = uVar9,
        uVar11 = uVar10, uVar12 != h; uVar12 = uVar12 + 1) {
      while( true ) {
        if (uVar14 == 0) break;
        dst[uVar13] = (uint8_t)((uint)src1[uVar11] * (0x40 - (uint)mask[uVar5]) +
                                (uint)src0[uVar7] * (uint)mask[uVar5] + 0x20 >> 6);
        uVar14 = uVar14 - 1;
        uVar5 = uVar5 + 1;
        uVar7 = uVar7 + 1;
        uVar13 = uVar13 + 1;
        uVar11 = uVar11 + 1;
      }
      uVar9 = uVar9 + dst_stride;
      uVar10 = uVar10 + src1_stride;
      uVar8 = uVar8 + src0_stride;
      uVar4 = uVar4 + mask_stride;
    }
  }
  else if (subh == 1 && (subw ^ 1U) == 0) {
    uVar4 = 0;
    if (w < 1) {
      w = uVar4;
    }
    if (h < 1) {
      h = uVar4;
    }
    iVar2 = mask_stride * 2;
    uVar10 = 0;
    uVar12 = 0;
    iVar3 = 0;
    for (uVar8 = 0; uVar8 != h; uVar8 = uVar8 + 1) {
      uVar9 = uVar10;
      uVar11 = uVar12;
      uVar5 = uVar4;
      for (uVar14 = 0; (uint)(w * 2) != uVar14; uVar14 = uVar14 + 2) {
        iVar1 = (int)uVar14;
        uVar7 = (uint)mask[mask_stride + iVar1 + 1] +
                (uint)mask[iVar3 + iVar1 + 1] +
                (uint)mask[mask_stride + iVar1] + (uint)mask[(uint)(iVar3 + iVar1)] + 2 >> 2;
        dst[uVar11] = (uint8_t)((uint)src1[uVar9] * (0x40 - uVar7) + src0[uVar5] * uVar7 + 0x20 >> 6
                               );
        uVar11 = uVar11 + 1;
        uVar9 = uVar9 + 1;
        uVar5 = uVar5 + 1;
      }
      iVar3 = iVar3 + iVar2;
      mask_stride = mask_stride + iVar2;
      uVar12 = uVar12 + dst_stride;
      uVar10 = uVar10 + src1_stride;
      uVar4 = uVar4 + src0_stride;
    }
  }
  else {
    uVar4 = 0;
    if (w < 1) {
      w = uVar4;
    }
    if (h < 1) {
      h = uVar4;
    }
    if ((subw ^ 1U) == 0 && subh == 0) {
      uVar8 = 0;
      uVar10 = 0;
      uVar9 = 0;
      uVar4 = 0;
      for (uVar12 = 0; uVar14 = (ulong)(uint)w, uVar11 = uVar8, uVar5 = uVar10, uVar7 = uVar4,
          uVar13 = uVar9, uVar12 != h; uVar12 = uVar12 + 1) {
        while (uVar14 != 0) {
          uVar6 = (uint)mask[uVar7] + (uint)mask[uVar7 + 1] + 1 >> 1 & 0xff;
          dst[uVar13] = (uint8_t)((uint)src1[uVar5] * (0x40 - uVar6) + src0[uVar11] * uVar6 + 0x20
                                 >> 6);
          uVar14 = uVar14 - 1;
          uVar11 = uVar11 + 1;
          uVar5 = uVar5 + 1;
          uVar7 = uVar7 + 2;
          uVar13 = uVar13 + 1;
        }
        uVar4 = uVar4 + mask_stride;
        uVar9 = uVar9 + dst_stride;
        uVar10 = uVar10 + src1_stride;
        uVar8 = uVar8 + src0_stride;
      }
    }
    else {
      uVar10 = 0;
      uVar9 = 0;
      uVar8 = 0;
      for (uVar12 = 0; uVar14 = (ulong)(uint)w, uVar13 = uVar9, uVar11 = uVar4, uVar5 = uVar10,
          uVar7 = uVar8, uVar12 != h; uVar12 = uVar12 + 1) {
        while( true ) {
          if (uVar14 == 0) break;
          uVar6 = (uint)mask[uVar11] + (uint)mask[mask_stride + uVar11] + 1 >> 1 & 0xff;
          dst[uVar7] = (uint8_t)(src0[uVar5] * uVar6 + (uint)src1[uVar13] * (0x40 - uVar6) + 0x20 >>
                                6);
          uVar14 = uVar14 - 1;
          uVar13 = uVar13 + 1;
          uVar11 = uVar11 + 1;
          uVar5 = uVar5 + 1;
          uVar7 = uVar7 + 1;
        }
        uVar8 = uVar8 + dst_stride;
        uVar9 = uVar9 + src1_stride;
        uVar10 = uVar10 + src0_stride;
        uVar4 = uVar4 + mask_stride * 2;
      }
    }
  }
  return;
}

Assistant:

void aom_blend_a64_mask_c(uint8_t *dst, uint32_t dst_stride,
                          const uint8_t *src0, uint32_t src0_stride,
                          const uint8_t *src1, uint32_t src1_stride,
                          const uint8_t *mask, uint32_t mask_stride, int w,
                          int h, int subw, int subh) {
  int i, j;

  assert(IMPLIES(src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES(src1 == dst, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  if (subw == 0 && subh == 0) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = mask[i * mask_stride + j];
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  } else if (subw == 1 && subh == 1) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = ROUND_POWER_OF_TWO(
            mask[(2 * i) * mask_stride + (2 * j)] +
                mask[(2 * i + 1) * mask_stride + (2 * j)] +
                mask[(2 * i) * mask_stride + (2 * j + 1)] +
                mask[(2 * i + 1) * mask_stride + (2 * j + 1)],
            2);
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  } else if (subw == 1 && subh == 0) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = AOM_BLEND_AVG(mask[i * mask_stride + (2 * j)],
                                    mask[i * mask_stride + (2 * j + 1)]);
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  } else {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = AOM_BLEND_AVG(mask[(2 * i) * mask_stride + j],
                                    mask[(2 * i + 1) * mask_stride + j]);
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  }
}